

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::Pattern::visit<slang::ast::ASTSerializer>(Pattern *this,ASTSerializer *visitor)

{
  (*(code *)(&DAT_004c9dc0 + *(int *)(&DAT_004c9dc0 + (ulong)this->kind * 4)))
            (this,this,&DAT_004c9dc0,&DAT_004c9dc0 + *(int *)(&DAT_004c9dc0 + (ulong)this->kind * 4)
            );
  return;
}

Assistant:

decltype(auto) Pattern::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case PatternKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        CASE(Invalid, InvalidPattern);
        CASE(Wildcard, WildcardPattern);
        CASE(Constant, ConstantPattern);
        CASE(Variable, VariablePattern);
        CASE(Tagged, TaggedPattern);
        CASE(Structure, StructurePattern);
    }
#undef CASE
    // clang-format on
    SLANG_UNREACHABLE;
}